

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaf2c.c
# Opt level: O3

void ga_f2c_get_cmd_args(int *argc,char ***argv)

{
  long lVar1;
  undefined8 uVar2;
  char **ppcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t __n;
  long lVar6;
  char cstring [255];
  char fstring [255];
  long local_258;
  undefined8 local_250;
  int *local_248;
  char ***local_240;
  char local_238 [520];
  
  local_248 = argc;
  local_240 = argv;
  uVar2 = f2c_iargc_();
  if (0xff < (int)uVar2) {
    printf("ga_f2c_get_cmd_args: too many cmd line args");
    armci_msg_abort(1);
  }
  ppcVar3 = (char **)malloc(0x7f8);
  if (ppcVar3 == (char **)0x0) {
    printf("ga_f2c_get_cmd_args: malloc iargv failed");
    armci_msg_abort(1);
  }
  lVar6 = (long)(int)uVar2;
  local_258 = 0;
  local_250 = uVar2;
  if (0 < lVar6) {
    do {
      f2c_getarg_(&local_258,local_238 + 0x100,0xff);
      sVar4 = 0x100;
      do {
        if (sVar4 == 1) {
          local_238[0] = '\0';
          goto LAB_001754b4;
        }
        __n = sVar4 - 1;
        lVar1 = sVar4 + 0xfe;
        sVar4 = __n;
      } while (local_238[lVar1] == ' ');
      if (0xfe < (long)__n) {
        __n = 0xfe;
      }
      local_238[__n] = '\0';
      memcpy(local_238,local_238 + 0x100,__n);
LAB_001754b4:
      pcVar5 = strdup(local_238);
      ppcVar3[local_258] = pcVar5;
      local_258 = local_258 + 1;
    } while (local_258 < lVar6);
  }
  *local_248 = (int)local_250;
  *local_240 = ppcVar3;
  ppcVar3[lVar6] = (char *)0x0;
  return;
}

Assistant:

void ga_f2c_get_cmd_args(int *argc, char ***argv)
{
    Integer i=0;
    int iargc=F2C_IARGC();
    char **iargv=NULL;

    if (iargc > F2C_GETARG_ARGV_MAX) {
        printf("ga_f2c_get_cmd_args: too many cmd line args");
        armci_msg_abort(1);
    }
    iargv = (char**)malloc(sizeof(char*)*F2C_GETARG_ARGV_MAX);
    if (!iargv) {
        printf("ga_f2c_get_cmd_args: malloc iargv failed");
        armci_msg_abort(1);
    }
    for (i=0; i<iargc; i++) {
        char fstring[F2C_GETARG_ARGLEN_MAX];
        char cstring[F2C_GETARG_ARGLEN_MAX];
        F2C_GETARG(&i, fstring, F2C_GETARG_ARGLEN_MAX);
        ga_f2cstring(fstring, F2C_GETARG_ARGLEN_MAX,
                cstring, F2C_GETARG_ARGLEN_MAX);
        iargv[i] = strdup(cstring);
    }
    *argc = iargc;
    *argv = iargv;
    iargv[iargc] = 0;
}